

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TexCubeShader::shadeFragments
          (TexCubeShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  uint uVar1;
  int fragNdx;
  float *pfVar2;
  Vec4 *output;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec4 coord;
  Vec3 texCoords [4];
  Vec4 colors [4];
  float local_b8;
  float local_b4;
  Vec3 local_a8 [4];
  Vec4 local_78 [4];
  
  lVar3 = 0;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)local_a8[0].m_data + lVar3));
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x30);
  lVar3 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)local_78[0].m_data + lVar3));
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  uVar4 = 0;
  uVar5 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar5 = uVar4;
  }
  do {
    if (uVar4 == uVar5) {
      return;
    }
    pfVar2 = local_a8[0].m_data + 2;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      rr::readTriangleVarying<float>((rr *)&local_b8,packets + uVar4,context,0,(int)lVar3);
      uVar1 = *(uint *)&(this->super_ShaderProgram).field_0x154;
      if (5 < uVar1) goto LAB_003686fa;
      fVar6 = local_b8 + local_b8 + -1.0;
      fVar8 = local_b4 + local_b4 + -1.0;
      switch(uVar1) {
      case 0:
        fVar9 = -1.0;
        fVar7 = fVar6;
        goto LAB_003686cc;
      case 1:
        fVar9 = 1.0;
        fVar7 = -fVar6;
LAB_003686cc:
        fVar6 = fVar9;
        fVar9 = -fVar8;
        fVar8 = fVar7;
        break;
      case 2:
        fVar8 = -fVar8;
        fVar9 = -1.0;
        break;
      case 3:
        fVar9 = 1.0;
        break;
      case 4:
        fVar6 = -fVar6;
        fVar9 = -fVar8;
        fVar8 = -1.0;
        break;
      case 5:
        fVar9 = -fVar8;
        fVar8 = 1.0;
      }
      ((Vec3 *)(pfVar2 + -2))->m_data[0] = fVar6;
      pfVar2[-1] = fVar9;
      *pfVar2 = fVar8;
LAB_003686fa:
      pfVar2 = pfVar2 + 3;
    }
    output = local_78;
    sglr::rc::TextureCube::sample4
              ((((this->super_ShaderProgram).m_uniforms.
                 super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                 super__Vector_impl_data._M_start)->sampler).texCube,output,local_a8,0.0);
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>(context,(int)uVar4,(int)lVar3,0,output);
      output = output + 1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec3 texCoords[4];
		tcu::Vec4 colors[4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			// setup tex coords
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			{
				const tcu::Vec4	coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
				const float		x		= coord.x()*2.0f - 1.0f;
				const float		y		= coord.y()*2.0f - 1.0f;

				// Swizzle tex coords
				switch (m_face)
				{
					case tcu::CUBEFACE_NEGATIVE_X:	texCoords[fragNdx] = tcu::Vec3(-1.0f,    -y,    +x);		break;
					case tcu::CUBEFACE_POSITIVE_X:	texCoords[fragNdx] = tcu::Vec3(+1.0f,    -y,    -x);		break;
					case tcu::CUBEFACE_NEGATIVE_Y:	texCoords[fragNdx] = tcu::Vec3(   +x, -1.0f,    -y);		break;
					case tcu::CUBEFACE_POSITIVE_Y:	texCoords[fragNdx] = tcu::Vec3(   +x, +1.0f,    +y);		break;
					case tcu::CUBEFACE_NEGATIVE_Z:	texCoords[fragNdx] = tcu::Vec3(   -x,    -y, -1.0f);		break;
					case tcu::CUBEFACE_POSITIVE_Z:	texCoords[fragNdx] = tcu::Vec3(   +x,    -y, +1.0f);		break;
					default:
						DE_ASSERT(false);
				}
			}

			// Sample
			m_uniforms[0].sampler.texCube->sample4(colors, texCoords);

			// Write out
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, colors[fragNdx]);
		}
	}